

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtablewidget.cpp
# Opt level: O1

QList<QTableWidgetItem_*> * __thiscall
QTableModel::columnItems
          (QList<QTableWidgetItem_*> *__return_storage_ptr__,QTableModel *this,int column)

{
  int iVar1;
  QTableWidgetItem *pQVar2;
  int row;
  long in_FS_OFFSET;
  QTableWidgetItem *local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (QTableWidgetItem **)0x0;
  (__return_storage_ptr__->d).size = 0;
  local_50 = (QTableWidgetItem *)0xffffffffffffffff;
  local_48 = 0;
  uStack_40 = 0;
  iVar1 = (**(code **)(*(long *)this + 0x78))(this);
  QList<QTableWidgetItem_*>::reserve(__return_storage_ptr__,(long)iVar1);
  if (0 < iVar1) {
    row = 0;
    do {
      pQVar2 = item(this,row,column);
      if (pQVar2 == (QTableWidgetItem *)0x0) break;
      local_50 = pQVar2;
      QtPrivate::QPodArrayOps<QTableWidgetItem*>::emplace<QTableWidgetItem*&>
                ((QPodArrayOps<QTableWidgetItem*> *)__return_storage_ptr__,
                 (__return_storage_ptr__->d).size,&local_50);
      QList<QTableWidgetItem_*>::end(__return_storage_ptr__);
      row = row + 1;
    } while (iVar1 != row);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QList<QTableWidgetItem *> QTableModel::columnItems(int column) const
{
    QList<QTableWidgetItem *> items;
    int rc = rowCount();
    items.reserve(rc);
    for (int row = 0; row < rc; ++row) {
        QTableWidgetItem *itm = item(row, column);
        if (itm == nullptr) {
            // no more sortable items (all 0-items are
            // at the end of the table when it is sorted)
            break;
        }
        items.append(itm);
    }
    return items;
}